

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,sync_declaration_t *d)

{
  pointer psVar1;
  system_t *this_00;
  shared_ptr<tchecker::parsing::sync_constraint_t> *c;
  pointer psVar2;
  event_id_t event;
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  v;
  process_id_t pid;
  sync_strength_t local_98;
  event_id_t local_94;
  sync_declaration_t *local_90;
  _Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_68;
  
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = (d->_syncs).
           super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = d;
  for (psVar2 = (d->_syncs).
                super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    local_68._M_buckets._0_4_ =
         processes_t::process_id
                   (&this->_system->super_processes_t,
                    &((((psVar2->
                        super___shared_ptr<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->_process).
                      super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_name);
    local_94 = events_t::event_id(&this->_system->super_events_t,
                                  &((((psVar2->
                                      super___shared_ptr<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->_event).
                                    super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_name);
    local_98 = ((psVar2->
                super___shared_ptr<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->_strength;
    std::
    vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>
    ::emplace_back<unsigned_int&,unsigned_int&,tchecker::sync_strength_t>
              ((vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>
                *)&local_88,(uint *)&local_68,&local_94,&local_98);
  }
  this_00 = this->_system;
  attributes_t::attributes_t
            ((attributes_t *)&local_68,
             &(local_90->super_inner_declaration_t).super_declaration_t._attr);
  system_t::add_synchronization
            (this_00,(vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                      *)&local_88,(attributes_t *)&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&local_68);
  std::
  _Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ::~_Vector_base(&local_88);
  return;
}

Assistant:

virtual void visit(tchecker::parsing::sync_declaration_t const & d)
  {
    std::vector<tchecker::system::sync_constraint_t> v;
    for (std::shared_ptr<tchecker::parsing::sync_constraint_t> const & c : d.sync_constraints()) {
      tchecker::process_id_t pid = _system.process_id(c->process().name());
      tchecker::event_id_t event = _system.event_id(c->event().name());
      v.emplace_back(pid, event, c->strength());
    }

    _system.add_synchronization(v, d.attributes());
  }